

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

QString * __thiscall
QSettingsPrivate::normalizedKey
          (QString *__return_storage_ptr__,QSettingsPrivate *this,QAnyStringView key)

{
  char16_t *pcVar1;
  __off_t extraout_RDX;
  __off_t _Var2;
  char16_t *this_00;
  QSettingsPrivate *pQVar3;
  QSettingsPrivate *pQVar4;
  ulong size;
  QSettingsPrivate *pQVar5;
  bool bVar6;
  QLatin1StringView in;
  QByteArrayView in_00;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  
  size = (ulong)key.field_0.m_data & 0x3fffffffffffffff;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,size,Uninitialized);
  this_00 = (__return_storage_ptr__->d).ptr;
  if ((QLatin1 *)this_00 == (QLatin1 *)0x0) {
    this_00 = L"";
  }
  _Var2 = extraout_RDX;
  if (((ulong)key.field_0.m_data & 0xc000000000000000) == 0x4000000000000000) {
    pQVar5 = (QSettingsPrivate *)
             ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + size);
    while (bVar6 = this == pQVar5, pQVar4 = this, !bVar6) {
      while (pQVar3 = pQVar4,
            *(char *)&(pQVar4->super_QObjectPrivate).super_QObjectData._vptr_QObjectData == '/') {
        pQVar4 = (QSettingsPrivate *)
                 ((long)&(pQVar4->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
        this = (QSettingsPrivate *)
               ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
        if (pQVar4 == pQVar5) goto LAB_00434d36;
      }
      do {
        if (*(char *)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData == '/')
        break;
        pQVar3 = (QSettingsPrivate *)
                 ((long)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
      } while (pQVar3 != pQVar5);
      in.m_data = (char *)this;
      in.m_size = (qsizetype)pQVar4;
      this_00 = QLatin1::convertToUnicode
                          ((QLatin1 *)this_00,(char16_t *)((long)pQVar3 - (long)this),in);
      _Var2 = extraout_RDX_00;
      if (pQVar3 == pQVar5) break;
      *this_00 = L'/';
      this_00 = (char16_t *)((long)this_00 + 2);
      this = (QSettingsPrivate *)
             ((long)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
    }
  }
  else {
    pQVar5 = (QSettingsPrivate *)
             ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + size);
    while (bVar6 = this == pQVar5, pQVar4 = this, !bVar6) {
      while (pQVar3 = pQVar4,
            *(char *)&(pQVar4->super_QObjectPrivate).super_QObjectData._vptr_QObjectData == '/') {
        pQVar4 = (QSettingsPrivate *)
                 ((long)&(pQVar4->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
        this = (QSettingsPrivate *)
               ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
        if (pQVar4 == pQVar5) goto LAB_00434d36;
      }
      do {
        if (*(char *)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData == '/')
        break;
        pQVar3 = (QSettingsPrivate *)
                 ((long)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
      } while (pQVar3 != pQVar5);
      in_00.m_data = (storage_type *)this;
      in_00.m_size = (qsizetype)pQVar4;
      this_00 = QUtf8::convertToUnicode
                          ((QUtf8 *)this_00,(char16_t *)((long)pQVar3 - (long)this),in_00);
      _Var2 = extraout_RDX_01;
      if (pQVar3 == pQVar5) break;
      *this_00 = L'/';
      this_00 = (char16_t *)((long)this_00 + 2);
      this = (QSettingsPrivate *)
             ((long)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
    }
  }
LAB_00434d39:
  if (bVar6) {
    pcVar1 = (__return_storage_ptr__->d).ptr;
    if ((QLatin1 *)pcVar1 == (QLatin1 *)0x0) {
      pcVar1 = L"";
    }
    this_00 = (char16_t *)((long)this_00 + (ulong)(this_00 == pcVar1) * 2 + -2);
  }
  pcVar1 = (__return_storage_ptr__->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    pcVar1 = L"";
  }
  QString::truncate(__return_storage_ptr__,(char *)((long)this_00 - (long)pcVar1 >> 1),_Var2);
  return __return_storage_ptr__;
LAB_00434d36:
  bVar6 = true;
  goto LAB_00434d39;
}

Assistant:

QString QSettingsPrivate::normalizedKey(QAnyStringView key)
{
    QString result(key.size(), Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData()); // don't detach

    const bool maybeEndsInSlash = key.visit([&out](auto key) {
        using View = decltype(key);

        auto it = key.begin();
        const auto end = key.end();

        while (it != end) {
            while (*it == u'/') {
                ++it;
                if (it == end)
                    return true;
            }
            auto mark = it;
            while (*it != u'/') {
                ++it;
                if (it == end)
                    break;
            }
            out = write(out, View{mark, it});
            if (it == end)
                return false;
            Q_ASSERT(*it == u'/');
            *out++ = u'/';
            ++it;
        }
        return true;
    });

    if (maybeEndsInSlash && out != result.constData())
        --out; // remove the trailing slash
    result.truncate(out - result.constData());
    return result;
}